

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::torrent::remove_time_critical_piece
          (torrent *this,piece_index_t piece,bool finished)

{
  bool bVar1;
  pointer ptVar2;
  int64_t v;
  alert_manager *this_00;
  error_category *cat;
  pointer this_01;
  const_iterator local_a0;
  undefined1 local_91;
  int local_90;
  error_code local_80;
  undefined1 local_70 [19];
  bitfield_flag local_5d;
  int local_5c;
  time_point tStack_58;
  int diff;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  int local_44;
  time_point tStack_40;
  int dl_time;
  int local_38;
  uchar local_33;
  uchar local_32;
  bitfield_flag local_31;
  __normal_iterator<libtorrent::aux::time_critical_piece_*,_std::vector<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>_>
  local_30;
  iterator end;
  iterator i;
  bool finished_local;
  torrent *this_local;
  piece_index_t piece_local;
  
  this_local._4_4_ = piece.m_val;
  end = ::std::
        vector<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>
        ::begin(&this->m_time_critical_pieces);
  local_30._M_current =
       (time_critical_piece *)
       ::std::
       vector<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>
       ::end(&this->m_time_critical_pieces);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&end,&local_30);
    if (!bVar1) {
      return;
    }
    ptVar2 = __gnu_cxx::
             __normal_iterator<libtorrent::aux::time_critical_piece_*,_std::vector<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>_>
             ::operator->(&end);
    bVar1 = strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::operator!=
                      (&ptVar2->piece,
                       (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)
                       ((long)&this_local + 4));
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<libtorrent::aux::time_critical_piece_*,_std::vector<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>_>
    ::operator++(&end);
  }
  if (finished) {
    ptVar2 = __gnu_cxx::
             __normal_iterator<libtorrent::aux::time_critical_piece_*,_std::vector<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>_>
             ::operator->(&end);
    local_32 = (ptVar2->flags).m_val;
    local_33 = '\x01';
    local_31 = (bitfield_flag)
               libtorrent::flags::operator&
                         ((bitfield_flag<unsigned_char,_libtorrent::deadline_flags_tag,_void>)
                          local_32,(bitfield_flag<unsigned_char,_libtorrent::deadline_flags_tag,_void>
                                    )'\x01');
    bVar1 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(&local_31);
    if (bVar1) {
      ptVar2 = __gnu_cxx::
               __normal_iterator<libtorrent::aux::time_critical_piece_*,_std::vector<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>_>
               ::operator->(&end);
      local_38 = (ptVar2->piece).m_val;
      read_piece(this,(piece_index_t)local_38);
    }
    ptVar2 = __gnu_cxx::
             __normal_iterator<libtorrent::aux::time_critical_piece_*,_std::vector<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>_>
             ::operator->(&end);
    tStack_40 = min_time();
    bVar1 = ::std::chrono::operator!=(&ptVar2->first_requested,&stack0xffffffffffffffc0);
    if (bVar1) {
      tStack_58 = time_now();
      ptVar2 = __gnu_cxx::
               __normal_iterator<libtorrent::aux::time_critical_piece_*,_std::vector<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>_>
               ::operator->(&end);
      local_50._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           ::std::chrono::operator-(&stack0xffffffffffffffa8,&ptVar2->first_requested);
      v = total_milliseconds<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                    ((duration<long,_std::ratio<1L,_1000000000L>_>)local_50._M_pi);
      local_44 = numeric_cast<int,long,void>(v);
      if (this->m_average_piece_time == 0) {
        this->m_average_piece_time = local_44;
      }
      else {
        local_5c = local_44 - this->m_average_piece_time;
        if (local_5c < 1) {
          local_5c = -local_5c;
        }
        if (this->m_piece_time_deviation == 0) {
          this->m_piece_time_deviation = local_5c;
        }
        else {
          this->m_piece_time_deviation = (this->m_piece_time_deviation * 9 + local_5c) / 10;
        }
        this->m_average_piece_time = (this->m_average_piece_time * 9 + local_44) / 10;
      }
    }
  }
  else {
    ptVar2 = __gnu_cxx::
             __normal_iterator<libtorrent::aux::time_critical_piece_*,_std::vector<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>_>
             ::operator->(&end);
    local_70[0x12] = (ptVar2->flags).m_val;
    local_70[0x11] = '\x01';
    local_5d = (bitfield_flag)
               libtorrent::flags::operator&
                         (local_70[0x12],
                          (bitfield_flag<unsigned_char,_libtorrent::deadline_flags_tag,_void>)'\x01'
                         );
    bVar1 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(&local_5d);
    if (bVar1) {
      this_00 = alerts(this);
      get_handle((torrent *)local_70);
      cat = boost::system::generic_category();
      boost::system::error_code::error_code(&local_80,0x7d,cat);
      alert_manager::
      emplace_alert<libtorrent::read_piece_alert,libtorrent::torrent_handle,libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>const&,boost::system::error_code>
                (this_00,(torrent_handle *)local_70,
                 (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)
                 ((long)&this_local + 4),&local_80);
      torrent_handle::~torrent_handle((torrent_handle *)local_70);
    }
  }
  bVar1 = has_picker(this);
  if (bVar1) {
    this_01 = ::std::
              unique_ptr<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
              ::operator->(&(this->super_torrent_hot_members).m_picker);
    local_90 = this_local._4_4_;
    local_91 = 1;
    piece_picker::set_piece_priority(this_01,this_local._4_4_,(download_priority_t)0x1);
  }
  __gnu_cxx::
  __normal_iterator<libtorrent::aux::time_critical_piece_const*,std::vector<libtorrent::aux::time_critical_piece,std::allocator<libtorrent::aux::time_critical_piece>>>
  ::__normal_iterator<libtorrent::aux::time_critical_piece*>
            ((__normal_iterator<libtorrent::aux::time_critical_piece_const*,std::vector<libtorrent::aux::time_critical_piece,std::allocator<libtorrent::aux::time_critical_piece>>>
              *)&local_a0,&end);
  ::std::
  vector<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>
  ::erase(&this->m_time_critical_pieces,local_a0);
  return;
}

Assistant:

void torrent::remove_time_critical_piece(piece_index_t const piece, bool const finished)
	{
		for (auto i = m_time_critical_pieces.begin(), end(m_time_critical_pieces.end());
			i != end; ++i)
		{
			if (i->piece != piece) continue;
			if (finished)
			{
				if (i->flags & torrent_handle::alert_when_available)
				{
					read_piece(i->piece);
				}

				// if first_requested is min_time(), it wasn't requested as a critical piece
				// and we shouldn't adjust any average download times
				if (i->first_requested != min_time())
				{
					// update the average download time and average
					// download time deviation
					int const dl_time = aux::numeric_cast<int>(total_milliseconds(aux::time_now() - i->first_requested));

					if (m_average_piece_time == 0)
					{
						m_average_piece_time = dl_time;
					}
					else
					{
						int diff = std::abs(dl_time - m_average_piece_time);
						if (m_piece_time_deviation == 0) m_piece_time_deviation = diff;
						else m_piece_time_deviation = (m_piece_time_deviation * 9 + diff) / 10;

						m_average_piece_time = (m_average_piece_time * 9 + dl_time) / 10;
					}
				}
			}
			else if (i->flags & torrent_handle::alert_when_available)
			{
				// post an empty read_piece_alert to indicate it failed
				alerts().emplace_alert<read_piece_alert>(
					get_handle(), piece, error_code(boost::system::errc::operation_canceled, generic_category()));
			}
			if (has_picker()) m_picker->set_piece_priority(piece, low_priority);
			m_time_critical_pieces.erase(i);
			return;
		}
	}